

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error appendAttributeValue
                    (XML_Parser parser,ENCODING *enc,XML_Bool isCdata,char *ptr,char *end,
                    STRING_POOL *pool,XML_Account account)

{
  char cVar1;
  char *pcVar2;
  ENCODING *pEVar3;
  XML_Bool XVar4;
  int iVar5;
  uint uVar6;
  XML_Error XVar7;
  XML_Char *pXVar8;
  NAMED *pNVar9;
  ulong uVar10;
  bool bVar11;
  byte bVar12;
  char *next;
  XML_Char buf [4];
  XML_Account in_stack_ffffffffffffff88;
  XML_Error local_74;
  char *local_60;
  DTD *local_58;
  char local_4c [4];
  char *local_48;
  STRING_POOL *local_40;
  STRING_POOL *local_38;
  
  local_58 = parser->m_dtd;
  local_38 = &parser->m_temp2Pool;
  local_40 = &local_58->pool;
  do {
    local_60 = ptr;
    iVar5 = (*enc->literalScanners[0])(enc,ptr,end,&local_60);
    bVar12 = 1;
    switch(iVar5) {
    case 0:
      local_74 = XML_ERROR_INVALID_TOKEN;
      if (parser->m_encoding == enc) {
        parser->m_eventPtr = local_60;
      }
      goto LAB_005fbf5b;
    case 6:
      pXVar8 = poolAppend(pool,enc,ptr,local_60);
      if (pXVar8 != (XML_Char *)0x0) goto LAB_005fbfbd;
      bVar12 = 1;
      local_74 = XML_ERROR_NO_MEMORY;
      goto LAB_005fbfc5;
    case 7:
      break;
    case 9:
      iVar5 = (*enc->predefinedEntityName)
                        (enc,ptr + enc->minBytesPerChar,local_60 + -(long)enc->minBytesPerChar);
      if ((char)iVar5 == '\0') {
        pXVar8 = poolStoreString(local_38,enc,ptr + enc->minBytesPerChar,
                                 local_60 + -(long)enc->minBytesPerChar);
        bVar12 = 1;
        if (pXVar8 != (XML_Char *)0x0) {
          pNVar9 = lookup(parser,&local_58->generalEntities,pXVar8,0);
          (parser->m_temp2Pool).ptr = (parser->m_temp2Pool).start;
          if (local_40 != pool) {
            if (local_58->hasParamEntityRefs != '\0') {
              bVar11 = local_58->standalone != '\0';
              goto LAB_005fbfe2;
            }
LAB_005fbfe6:
            if (pNVar9 == (NAMED *)0x0) {
              local_74 = XML_ERROR_UNDEFINED_ENTITY;
            }
            else {
              if (*(char *)((long)&pNVar9[7].name + 2) != '\0') goto LAB_005fc00a;
              local_74 = XML_ERROR_ENTITY_DECLARED_IN_PE;
            }
            goto LAB_005fbfb7;
          }
          if (local_58->standalone == '\0') {
            bVar11 = local_58->hasParamEntityRefs == '\0';
          }
          else {
            bVar11 = parser->m_openInternalEntities == (OPEN_INTERNAL_ENTITY *)0x0;
          }
LAB_005fbfe2:
          if (bVar11) goto LAB_005fbfe6;
          if (pNVar9 == (NAMED *)0x0) {
            bVar12 = 4;
            goto LAB_005fbfb7;
          }
LAB_005fc00a:
          if (*(char *)&pNVar9[7].name != '\0') {
            local_74 = XML_ERROR_RECURSIVE_ENTITY_REF;
LAB_005fc033:
            pEVar3 = parser->m_encoding;
            goto joined_r0x005fbec2;
          }
          if (pNVar9[6].name != (KEY)0x0) {
            local_74 = XML_ERROR_BINARY_ENTITY_REF;
            goto LAB_005fc033;
          }
          pcVar2 = pNVar9[1].name;
          if (pcVar2 == (char *)0x0) {
            local_74 = XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
            if (parser->m_encoding != enc) goto LAB_005fbfb7;
            goto LAB_005fc040;
          }
          *(undefined1 *)&pNVar9[7].name = 1;
          XVar7 = appendAttributeValue
                            (parser,parser->m_internalEncoding,isCdata,pcVar2,
                             pcVar2 + *(int *)&pNVar9[2].name,pool,in_stack_ffffffffffffff88);
          *(undefined1 *)&pNVar9[7].name = 0;
          bVar12 = XVar7 != XML_ERROR_NONE;
          if ((bool)bVar12) {
            local_74 = XVar7;
          }
          goto LAB_005fbfb7;
        }
      }
      else if ((pool->ptr != pool->end) || (XVar4 = poolGrow(pool), XVar4 != '\0')) {
        pcVar2 = pool->ptr;
        pool->ptr = pcVar2 + 1;
        *pcVar2 = (char)iVar5;
        bVar12 = 4;
        goto LAB_005fbfb7;
      }
      bVar12 = 1;
      local_74 = XML_ERROR_NO_MEMORY;
      goto LAB_005fbfb7;
    case 10:
      iVar5 = (*enc->charRefNumber)(enc,ptr);
      if (-1 < iVar5) {
        if ((isCdata == '\0') && (iVar5 == 0x20)) {
          bVar12 = 4;
          if ((pool->ptr == pool->start) || (pool->ptr[-1] == ' ')) goto LAB_005fbfb7;
        }
        uVar6 = XmlUtf8Encode(iVar5,local_4c);
        bVar12 = 0;
        if (0 < (int)uVar6) {
          local_48 = end;
          uVar10 = 0;
          do {
            if ((pool->ptr == pool->end) && (XVar4 = poolGrow(pool), XVar4 == '\0')) {
              bVar12 = 1;
              local_74 = XML_ERROR_NO_MEMORY;
              end = local_48;
              break;
            }
            cVar1 = local_4c[uVar10];
            pcVar2 = pool->ptr;
            pool->ptr = pcVar2 + 1;
            *pcVar2 = cVar1;
            uVar10 = uVar10 + 1;
            end = local_48;
          } while (uVar6 != uVar10);
        }
        goto LAB_005fbfb7;
      }
      local_74 = XML_ERROR_BAD_CHAR_REF;
      pEVar3 = parser->m_encoding;
joined_r0x005fbec2:
      bVar12 = 1;
      if (pEVar3 == enc) {
LAB_005fc040:
        bVar12 = 1;
        parser->m_eventPtr = ptr;
      }
LAB_005fbfb7:
      if ((bVar12 & 3) == 0) goto LAB_005fbfbd;
      goto LAB_005fbfc5;
    case -4:
      local_74 = XML_ERROR_NONE;
      goto LAB_005fbf5b;
    case -3:
      local_60 = ptr + enc->minBytesPerChar;
      break;
    case -2:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 8:
switchD_005fbcaf_caseD_fffffffe:
      local_74 = XML_ERROR_UNEXPECTED_STATE;
      goto LAB_005fbe4f;
    case -1:
      local_74 = XML_ERROR_INVALID_TOKEN;
LAB_005fbe4f:
      if (parser->m_encoding != enc) goto LAB_005fbf5b;
      parser->m_eventPtr = ptr;
      goto LAB_005fbfc5;
    default:
      if (iVar5 != 0x27) goto switchD_005fbcaf_caseD_fffffffe;
    }
    if ((isCdata == '\0') && ((pool->ptr == pool->start || (pool->ptr[-1] == ' ')))) {
LAB_005fbfbd:
      bVar12 = 0;
      ptr = local_60;
    }
    else {
      if ((pool->ptr != pool->end) || (XVar4 = poolGrow(pool), XVar4 != '\0')) {
        pXVar8 = pool->ptr;
        pool->ptr = pXVar8 + 1;
        *pXVar8 = ' ';
        goto LAB_005fbfbd;
      }
      local_74 = XML_ERROR_NO_MEMORY;
LAB_005fbf5b:
      bVar12 = 1;
    }
LAB_005fbfc5:
    if (bVar12 != 0) {
      return local_74;
    }
  } while( true );
}

Assistant:

static enum XML_Error
appendAttributeValue(XML_Parser parser, const ENCODING *enc, XML_Bool isCdata,
                     const char *ptr, const char *end, STRING_POOL *pool,
                     enum XML_Account account) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
#ifndef XML_DTD
  UNUSED_P(account);
#endif

  for (;;) {
    const char *next
        = ptr; /* XmlAttributeValueTok doesn't always set the last arg */
    int tok = XmlAttributeValueTok(enc, ptr, end, &next);
#ifdef XML_DTD
    if (! accountingDiffTolerated(parser, tok, ptr, next, __LINE__, account)) {
      accountingOnAbort(parser);
      return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
    }
#endif
    switch (tok) {
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_INVALID:
      if (enc == parser->m_encoding)
        parser->m_eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (enc == parser->m_encoding)
        parser->m_eventPtr = ptr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_CHAR_REF: {
      XML_Char buf[XML_ENCODE_MAX];
      int i;
      int n = XmlCharRefNumber(enc, ptr);
      if (n < 0) {
        if (enc == parser->m_encoding)
          parser->m_eventPtr = ptr;
        return XML_ERROR_BAD_CHAR_REF;
      }
      if (! isCdata && n == 0x20 /* space */
          && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
        break;
      n = XmlEncode(n, (ICHAR *)buf);
      /* The XmlEncode() functions can never return 0 here.  That
       * error return happens if the code point passed in is either
       * negative or greater than or equal to 0x110000.  The
       * XmlCharRefNumber() functions will all return a number
       * strictly less than 0x110000 or a negative value if an error
       * occurred.  The negative value is intercepted above, so
       * XmlEncode() is never passed a value it might return an
       * error for.
       */
      for (i = 0; i < n; i++) {
        if (! poolAppendChar(pool, buf[i]))
          return XML_ERROR_NO_MEMORY;
      }
    } break;
    case XML_TOK_DATA_CHARS:
      if (! poolAppend(pool, enc, ptr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = ptr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_ATTRIBUTE_VALUE_S:
    case XML_TOK_DATA_NEWLINE:
      if (! isCdata && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
        break;
      if (! poolAppendChar(pool, 0x20))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_ENTITY_REF: {
      const XML_Char *name;
      ENTITY *entity;
      char checkEntityDecl;
      XML_Char ch = (XML_Char)XmlPredefinedEntityName(
          enc, ptr + enc->minBytesPerChar, next - enc->minBytesPerChar);
      if (ch) {
#ifdef XML_DTD
        /* NOTE: We are replacing 4-6 characters original input for 1 character
         *       so there is no amplification and hence recording without
         *       protection. */
        accountingDiffTolerated(parser, tok, (char *)&ch,
                                ((char *)&ch) + sizeof(XML_Char), __LINE__,
                                XML_ACCOUNT_ENTITY_EXPANSION);
#endif /* XML_DTD */
        if (! poolAppendChar(pool, ch))
          return XML_ERROR_NO_MEMORY;
        break;
      }
      name = poolStoreString(&parser->m_temp2Pool, enc,
                             ptr + enc->minBytesPerChar,
                             next - enc->minBytesPerChar);
      if (! name)
        return XML_ERROR_NO_MEMORY;
      entity = (ENTITY *)lookup(parser, &dtd->generalEntities, name, 0);
      poolDiscard(&parser->m_temp2Pool);
      /* First, determine if a check for an existing declaration is needed;
         if yes, check that the entity exists, and that it is internal.
      */
      if (pool == &dtd->pool) /* are we called from prolog? */
        checkEntityDecl =
#ifdef XML_DTD
            parser->m_prologState.documentEntity &&
#endif /* XML_DTD */
            (dtd->standalone ? ! parser->m_openInternalEntities
                             : ! dtd->hasParamEntityRefs);
      else /* if (pool == &parser->m_tempPool): we are called from content */
        checkEntityDecl = ! dtd->hasParamEntityRefs || dtd->standalone;
      if (checkEntityDecl) {
        if (! entity)
          return XML_ERROR_UNDEFINED_ENTITY;
        else if (! entity->is_internal)
          return XML_ERROR_ENTITY_DECLARED_IN_PE;
      } else if (! entity) {
        /* Cannot report skipped entity here - see comments on
           parser->m_skippedEntityHandler.
        if (parser->m_skippedEntityHandler)
          parser->m_skippedEntityHandler(parser->m_handlerArg, name, 0);
        */
        /* Cannot call the default handler because this would be
           out of sync with the call to the startElementHandler.
        if ((pool == &parser->m_tempPool) && parser->m_defaultHandler)
          reportDefault(parser, enc, ptr, next);
        */
        break;
      }
      if (entity->open) {
        if (enc == parser->m_encoding) {
          /* It does not appear that this line can be executed.
           *
           * The "if (entity->open)" check catches recursive entity
           * definitions.  In order to be called with an open
           * entity, it must have gone through this code before and
           * been through the recursive call to
           * appendAttributeValue() some lines below.  That call
           * sets the local encoding ("enc") to the parser's
           * internal encoding (internal_utf8 or internal_utf16),
           * which can never be the same as the principle encoding.
           * It doesn't appear there is another code path that gets
           * here with entity->open being TRUE.
           *
           * Since it is not certain that this logic is watertight,
           * we keep the line and merely exclude it from coverage
           * tests.
           */
          parser->m_eventPtr = ptr; /* LCOV_EXCL_LINE */
        }
        return XML_ERROR_RECURSIVE_ENTITY_REF;
      }
      if (entity->notation) {
        if (enc == parser->m_encoding)
          parser->m_eventPtr = ptr;
        return XML_ERROR_BINARY_ENTITY_REF;
      }
      if (! entity->textPtr) {
        if (enc == parser->m_encoding)
          parser->m_eventPtr = ptr;
        return XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
      } else {
        enum XML_Error result;
        const XML_Char *textEnd = entity->textPtr + entity->textLen;
        entity->open = XML_TRUE;
#ifdef XML_DTD
        entityTrackingOnOpen(parser, entity, __LINE__);
#endif
        result = appendAttributeValue(parser, parser->m_internalEncoding,
                                      isCdata, (const char *)entity->textPtr,
                                      (const char *)textEnd, pool,
                                      XML_ACCOUNT_ENTITY_EXPANSION);
#ifdef XML_DTD
        entityTrackingOnClose(parser, entity, __LINE__);
#endif
        entity->open = XML_FALSE;
        if (result)
          return result;
      }
    } break;
    default:
      /* The only token returned by XmlAttributeValueTok() that does
       * not have an explicit case here is XML_TOK_PARTIAL_CHAR.
       * Getting that would require an entity name to contain an
       * incomplete XML character (e.g. \xE2\x82); however previous
       * tokenisers will have already recognised and rejected such
       * names before XmlAttributeValueTok() gets a look-in.  This
       * default case should be retained as a safety net, but the code
       * excluded from coverage tests.
       *
       * LCOV_EXCL_START
       */
      if (enc == parser->m_encoding)
        parser->m_eventPtr = ptr;
      return XML_ERROR_UNEXPECTED_STATE;
      /* LCOV_EXCL_STOP */
    }
    ptr = next;
  }
  /* not reached */
}